

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  istream *piVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rows;
  string line;
  local_search A;
  ifstream infile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  value_type local_2b0;
  local_search local_290;
  long local_228 [65];
  
  std::ifstream::ifstream((istream *)local_228,argv[1],_S_in);
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b0._M_string_length = 0;
  local_2b0.field_2._M_local_buf[0] = '\0';
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_228[0] + -0x18) + (char)(istream *)local_228
                           );
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_228,(string *)&local_2b0,cVar1);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_2c8,&local_2b0);
  }
  cvs_rk::local_search::local_search(&local_290,&local_2c8);
  std::
  _Rb_tree<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>,_std::_Identity<std::vector<bool,_std::allocator<bool>_>_>,_std::less<std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~_Rb_tree(&local_290.explored._M_t);
  std::
  vector<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
  ::~vector(&local_290.M.columns);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_290.M.rows);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c8);
  std::ifstream::~ifstream(local_228);
  return 0;
}

Assistant:

int main(int argc,char** argv) {//this_is_a_test

	std::ifstream infile(argv[1]);

	vector<string> rows;

	std::string line;
	while (std::getline(infile, line)) rows.push_back(line);

	auto A = local_search(rows);

}